

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

bool slang::ast::hasSimpleLabel(StatementSyntax *syntax)

{
  SyntaxKind SVar1;
  bool bVar2;
  
  if (syntax->label != (NamedLabelSyntax *)0x0) {
    SVar1 = (syntax->super_SyntaxNode).kind;
    bVar2 = false;
    if ((((SVar1 != ForLoopStatement) && (SVar1 != ForeachLoopStatement)) &&
        (SVar1 != ParallelBlockStatement)) &&
       ((SVar1 != RandSequenceStatement && (SVar1 != SequentialBlockStatement)))) {
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

static bool hasSimpleLabel(const StatementSyntax& syntax) {
    if (!syntax.label)
        return false;

    return syntax.kind != SyntaxKind::SequentialBlockStatement &&
           syntax.kind != SyntaxKind::ParallelBlockStatement &&
           syntax.kind != SyntaxKind::ForLoopStatement &&
           syntax.kind != SyntaxKind::ForeachLoopStatement &&
           syntax.kind != SyntaxKind::RandSequenceStatement;
}